

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

void mbedtls_ctr_drbg_update(mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t add_len)

{
  uchar local_58 [8];
  uchar add_input [48];
  size_t local_20;
  size_t add_len_local;
  uchar *additional_local;
  mbedtls_ctr_drbg_context *ctx_local;
  
  if (add_len != 0) {
    local_20 = add_len;
    if (0x180 < add_len) {
      local_20 = 0x180;
    }
    block_cipher_df(local_58,additional,local_20);
    ctr_drbg_update_internal(ctx,local_58);
  }
  return;
}

Assistant:

void mbedtls_ctr_drbg_update( mbedtls_ctr_drbg_context *ctx,
                      const unsigned char *additional, size_t add_len )
{
    unsigned char add_input[MBEDTLS_CTR_DRBG_SEEDLEN];

    if( add_len > 0 )
    {
        /* MAX_INPUT would be more logical here, but we have to match
         * block_cipher_df()'s limits since we can't propagate errors */
        if( add_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
            add_len = MBEDTLS_CTR_DRBG_MAX_SEED_INPUT;

        block_cipher_df( add_input, additional, add_len );
        ctr_drbg_update_internal( ctx, add_input );
    }
}